

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O1

void show_obj_list(olist_detail_t mode)

{
  char cVar1;
  size_t sVar2;
  int iVar3;
  wchar_t wVar4;
  olist_detail_t mode_00;
  char *pcVar5;
  long lVar6;
  wchar_t wVar7;
  uint uVar8;
  ulong uVar9;
  wchar_t col;
  wchar_t row;
  char tmp_val [80];
  char local_88 [88];
  
  max_len = 0;
  ex_width = L'\0';
  ex_offset = L'\0';
  mode_00 = mode;
  if ((mode & OLIST_WINDOW) != OLIST_NONE) {
    max_len = 0x28;
    mode_00 = mode & ~OLIST_WEIGHT;
    if (0x27 < Term->wid) {
      mode_00 = mode;
    }
  }
  set_obj_names(Term->wid < 0x32,player);
  sVar2 = max_len;
  if ((((mode_00 & OLIST_QUIVER) != OLIST_NONE) && (*player->upkeep->quiver != (object *)0x0)) &&
     (sVar2 = 0x18, 0x18 < max_len)) {
    sVar2 = max_len;
  }
  max_len = sVar2;
  if ((mode_00 & OLIST_WEIGHT) != OLIST_NONE) {
    ex_width = ex_width + L'\t';
  }
  if ((mode_00 & OLIST_PRICE) != OLIST_NONE) {
    ex_width = ex_width + L'\t';
  }
  if ((mode_00 & OLIST_FAIL) != OLIST_NONE) {
    ex_width = ex_width + L'\n';
  }
  uVar9 = 0;
  col = L'\0';
  wVar4 = L'\0';
  if ((mode & OLIST_WINDOW) == OLIST_NONE) {
    wVar4 = ~(ex_width + (wchar_t)max_len) + Term->wid;
    col = L'\0';
    if (L'\x02' < wVar4) {
      col = wVar4;
    }
    wVar4 = L'\x01';
  }
  ex_offset = (Term->wid - col) + ~ex_width;
  if (max_len <= (ulong)(long)ex_offset) {
    ex_offset = (wchar_t)max_len;
  }
  if (L'\0' < num_obj) {
    uVar9 = 0;
    do {
      show_obj((wchar_t)uVar9,wVar4,col,false,mode_00);
      wVar7 = (wchar_t)uVar9 + L'\x01';
      uVar9 = (ulong)(uint)wVar7;
    } while (wVar7 < num_obj);
  }
  if (((mode_00 & OLIST_QUIVER) != OLIST_NONE) &&
     (iVar3 = (player->upkeep->quiver_cnt + (uint)z_info->quiver_slot_size + -1) /
              (int)(uint)z_info->quiver_slot_size, 0 < iVar3)) {
    wVar7 = L'\x02';
    if (L'\x02' < col) {
      wVar7 = col;
    }
    lVar6 = 0;
    do {
      if ((int)lVar6 - iVar3 == -1) {
        uVar8 = player->upkeep->quiver_cnt - (uint)z_info->quiver_slot_size * (iVar3 + -1);
      }
      else {
        uVar8 = (uint)z_info->quiver_slot_size;
      }
      cVar1 = "abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"
              [lVar6 + (uVar9 - (mode & OLIST_WINDOW))];
      row = (int)uVar9 + wVar4 + (int)lVar6;
      prt("",row,wVar7 + L'\xfffffffe');
      strnfmt(local_88,0x50,"%c) ",(ulong)(uint)(int)cVar1);
      c_put_str('\x02',local_88,row,col);
      pcVar5 = "s";
      if (uVar8 == 1) {
        pcVar5 = "";
      }
      strnfmt(local_88,0x50,"in Quiver: %d missile%s",(ulong)uVar8,pcVar5);
      c_put_str('\x0f',local_88,row,col + L'\x03');
      lVar6 = lVar6 + 1;
    } while ((int)lVar6 != iVar3);
    uVar9 = (ulong)(uint)((int)uVar9 + (int)lVar6);
  }
  iVar3 = (int)uVar9;
  if ((mode & OLIST_WINDOW) == OLIST_NONE) {
    if ((0 < iVar3) && (iVar3 + wVar4 < L'\x18')) {
      wVar7 = L'\x02';
      if (L'\x02' < col) {
        wVar7 = col;
      }
      prt("",iVar3 + wVar4,wVar7 + L'\xfffffffe');
    }
  }
  else if (iVar3 < Term->hgt) {
    wVar7 = L'\x02';
    if (L'\x02' < col) {
      wVar7 = col;
    }
    do {
      prt("",(int)uVar9 + wVar4,wVar7 + L'\xfffffffe');
      uVar8 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar8;
    } while ((int)uVar8 < Term->hgt);
  }
  return;
}

Assistant:

static void show_obj_list(olist_detail_t mode)
{
	int i, row = 0, col = 0;
	char tmp_val[80];

	bool in_term = (mode & OLIST_WINDOW) ? true : false;
	bool terse = false;

	/* Initialize */
	max_len = 0;
	ex_width = 0;
	ex_offset = 0;

	if (in_term) max_len = 40;
	if (in_term && Term->wid < 40) mode &= ~(OLIST_WEIGHT);

	if (Term->wid < 50) terse = true;

	/* Set the names and get the max length */
	set_obj_names(terse, player);

	/* Take the quiver message into consideration */
	if (mode & OLIST_QUIVER && player->upkeep->quiver[0] != NULL)
		max_len = MAX(max_len, 24);

	/* Width of extra fields */
	if (mode & OLIST_WEIGHT) ex_width += 9;
	if (mode & OLIST_PRICE) ex_width += 9;
	if (mode & OLIST_FAIL) ex_width += 10;

	/* Determine beginning row and column */
	if (in_term) {
		/* Term window */
		row = 0;
		col = 0;
	} else {
		/* Main window */
		row = 1;
		col = Term->wid - 1 - max_len - ex_width;

		if (col < 3) col = 0;
	}

	/* Column offset of the first extra field */
	ex_offset = MIN(max_len, (size_t)(Term->wid - 1 - ex_width - col));

	/* Output the list */
	for (i = 0; i < num_obj; i++)
		show_obj(i, row, col, false, mode);

	/* For the inventory: print the quiver count */
	if (mode & OLIST_QUIVER) {
		int count, j;
		int quiver_slots = (player->upkeep->quiver_cnt + z_info->quiver_slot_size - 1) / z_info->quiver_slot_size;

		/* Quiver may take multiple lines */
		for (j = 0; j < quiver_slots; j++, i++) {
			const char *fmt = "in Quiver: %d missile%s";
			char letter = all_letters_nohjkl[in_term ? i - 1 : i];

			/* Number of missiles in this "slot" */
			if (j == quiver_slots - 1)
				count = player->upkeep->quiver_cnt - (z_info->quiver_slot_size * (quiver_slots - 1));
			else
				count = z_info->quiver_slot_size;

			/* Clear the line */
			prt("", row + i, MAX(col - 2, 0));

			/* Print the (disabled) label */
			strnfmt(tmp_val, sizeof(tmp_val), "%c) ", letter);
			c_put_str(COLOUR_SLATE, tmp_val, row + i, col);

			/* Print the count */
			strnfmt(tmp_val, sizeof(tmp_val), fmt, count,
					count == 1 ? "" : "s");
			c_put_str(COLOUR_L_UMBER, tmp_val, row + i, col + 3);
		}
	}

	/* Clear term windows */
	if (in_term) {
		for (; i < Term->hgt; i++)
			prt("", row + i, MAX(col - 2, 0));
	} else if (i > 0 && row + i < 24) {
		/* Print a drop shadow for the main window if necessary */
		prt("", row + i, MAX(col - 2, 0));
	}
}